

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O2

SlabThermodynamics * __thiscall
OpenMD::RNEMD::SPFMethod::calculateSlabTherodynamicQuantities
          (SlabThermodynamics *__return_storage_ptr__,SPFMethod *this,SelectionManager *sman)

{
  StuntDouble *this_00;
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int selei;
  Vector3d angMom;
  Mat3x3d I;
  Vector3d vel;
  
  Vector<double,_3U>::Vector
            ((Vector<double,_3U> *)__return_storage_ptr__,(Vector<double,_3U> *)OpenMD::V3Zero);
  __return_storage_ptr__->M = 0.0;
  __return_storage_ptr__->K = 0.0;
  selei = 0;
  this_00 = SelectionManager::beginSelected(sman,&selei);
  while (this_00 != (StuntDouble *)0x0) {
    dVar5 = this_00->mass_;
    StuntDouble::getVel((Vector3d *)&vel.super_Vector<double,_3U>,this_00);
    operator*((Vector<double,_3U> *)&I,dVar5,&vel.super_Vector<double,_3U>);
    Vector<double,_3U>::add((Vector<double,_3U> *)__return_storage_ptr__,(Vector<double,_3U> *)&I);
    __return_storage_ptr__->M = __return_storage_ptr__->M + dVar5;
    dVar4 = Vector<double,_3U>::lengthSquare(&vel.super_Vector<double,_3U>);
    __return_storage_ptr__->K = dVar4 * dVar5 + __return_storage_ptr__->K;
    if (this_00->objType_ - otDAtom < 2) {
      StuntDouble::getJ(&angMom,this_00);
      (*this_00->_vptr_StuntDouble[5])(&I,this_00);
      if (this_00->linear_ == true) {
        uVar3 = (long)(this_00->linearAxis_ + 1) % 3 & 0xffffffff;
        uVar2 = (long)(this_00->linearAxis_ + 2) % 3 & 0xffffffff;
        dVar5 = angMom.super_Vector<double,_3U>.data_[uVar3];
        dVar4 = (dVar5 * dVar5) /
                *(double *)
                 ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                 uVar3 * 0x20);
        dVar5 = angMom.super_Vector<double,_3U>.data_[uVar2];
        dVar5 = dVar5 * dVar5;
        pdVar1 = (double *)
                 ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                 uVar2 * 0x20);
      }
      else {
        auVar6._0_8_ = angMom.super_Vector<double,_3U>.data_[0] *
                       angMom.super_Vector<double,_3U>.data_[0];
        auVar6._8_8_ = angMom.super_Vector<double,_3U>.data_[1] *
                       angMom.super_Vector<double,_3U>.data_[1];
        auVar7._8_8_ = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1];
        auVar7._0_8_ = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
        auVar7 = divpd(auVar6,auVar7);
        dVar4 = auVar7._8_8_ + auVar7._0_8_;
        dVar5 = angMom.super_Vector<double,_3U>.data_[2] * angMom.super_Vector<double,_3U>.data_[2];
        pdVar1 = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2] + 2;
      }
      __return_storage_ptr__->K = dVar5 / *pdVar1 + dVar4 + __return_storage_ptr__->K;
    }
    this_00 = SelectionManager::nextSelected(sman,&selei);
  }
  __return_storage_ptr__->K = __return_storage_ptr__->K * 0.5;
  return __return_storage_ptr__;
}

Assistant:

SPFMethod::SlabThermodynamics SPFMethod::calculateSlabTherodynamicQuantities(
      SelectionManager& sman) {
    SlabThermodynamics slab {};

    int selei {}, selej {};

    StuntDouble* sd;

    for (sd = sman.beginSelected(selei); sd != NULL;
         sd = sman.nextSelected(selei)) {
      RealType mass = sd->getMass();
      Vector3d vel  = sd->getVel();

      slab.P += mass * vel;
      slab.M += mass;
      slab.K += mass * vel.lengthSquare();

      if (sd->isDirectional()) {
        Vector3d angMom = sd->getJ();
        Mat3x3d I       = sd->getI();
        if (sd->isLinear()) {
          int i = sd->linearAxis();
          int j = (i + 1) % 3;
          int k = (i + 2) % 3;
          slab.K +=
              angMom[j] * angMom[j] / I(j, j) + angMom[k] * angMom[k] / I(k, k);
        } else {
          slab.K += angMom[0] * angMom[0] / I(0, 0) +
                    angMom[1] * angMom[1] / I(1, 1) +
                    angMom[2] * angMom[2] / I(2, 2);
        }
      }
    }

    slab.K *= 0.5;

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &(slab.P[0]), 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &(slab.M), 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &(slab.K), 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    return slab;
  }